

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

Token * __thiscall enact::Lexer::number(Token *__return_storage_ptr__,Lexer *this)

{
  pointer pcVar1;
  size_t sVar2;
  TokenType type;
  size_t sVar3;
  char cVar4;
  int iVar5;
  
  pcVar1 = (this->m_source)._M_dataplus._M_p;
  sVar2 = this->m_current;
  cVar4 = pcVar1[sVar2];
  if ((byte)(cVar4 - 0x30U) < 10) {
    iVar5 = *(int *)&this->m_col;
    sVar3 = sVar2;
    do {
      iVar5 = iVar5 + 1;
      this->m_col = (col_t)iVar5;
      sVar2 = sVar3 + 1;
      this->m_current = sVar2;
      cVar4 = pcVar1[sVar3 + 1];
      sVar3 = sVar2;
    } while ((byte)(cVar4 - 0x30U) < 10);
  }
  type = INTEGER;
  if ((cVar4 == '.') && ((byte)(pcVar1[sVar2 + 1] - 0x30U) < 10)) {
    iVar5 = *(int *)&this->m_col;
    do {
      iVar5 = iVar5 + 1;
      sVar2 = sVar2 + 1;
      this->m_col = (col_t)iVar5;
      this->m_current = sVar2;
    } while ((byte)(pcVar1[sVar2] - 0x30U) < 10);
    type = FLOAT;
  }
  makeToken(__return_storage_ptr__,this,type);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::number() {
        while (isDigit(peek())) advance();

        TokenType type = TokenType::INTEGER;

        if (peek() == '.' && isDigit(peekNext())) {
            type = TokenType::FLOAT;
            advance();
            while (isDigit(peek())) advance();
        }

        return makeToken(type);
    }